

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O2

void __thiscall CompoundFile::File::initialize(File *this,string *fileName)

{
  Header *this_00;
  SAT *sat;
  istream *stream_00;
  pointer pcVar1;
  mapped_type *this_01;
  Exception *this_02;
  int32_t local_18c;
  Directory local_188;
  Directory local_150;
  MSAT msat;
  Stream stream;
  Directory local_60;
  
  stream_00 = this->m_stream;
  if (*(int *)(stream_00 + *(long *)(*(long *)stream_00 + -0x18) + 0x20) == 0) {
    this_00 = &this->m_header;
    Header::load(this_00,stream_00);
    MSAT::MSAT(&msat,this_00,this->m_stream);
    MSAT::buildSAT((SAT *)&stream,&msat);
    sat = &this->m_sat;
    std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::_M_move_assign
              (&sat->m_sat,&stream);
    std::_Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::~_Vector_base
              ((_Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)&stream);
    loadSSAT((SAT *)&stream,this_00,this->m_stream,sat);
    std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::_M_move_assign
              (&(this->m_ssat).m_sat,&stream);
    std::_Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::~_Vector_base
              ((_Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)&stream);
    local_188.m_name._M_dataplus._M_p._0_4_ = (this->m_header).m_dirStreamSecID.m_id;
    Stream::Stream(&stream,this_00,sat,(SecID *)&local_188,this->m_stream);
    local_188.m_name._M_dataplus._M_p = (pointer)&local_188.m_name.field_2;
    local_188.m_name._M_string_length = 0;
    local_188.m_name.field_2._M_local_buf[0] = L'\0';
    local_188.m_type = Empty;
    local_188.m_secID.m_id = -2;
    local_188.m_streamSize = 0;
    local_188.m_rightChild = -1;
    local_188.m_leftChild = -1;
    local_188.m_rootNode = -1;
    Directory::load(&local_188,&stream);
    (this->m_shortStreamFirstSector).m_id = local_188.m_secID.m_id;
    Stream::seek(&stream,local_188.m_rootNode << 7,FromBeginning);
    local_150.m_name._M_dataplus._M_p = (pointer)&local_150.m_name.field_2;
    local_150.m_name._M_string_length = 0;
    local_150.m_name.field_2._M_local_buf[0] = L'\0';
    local_150.m_type = Empty;
    local_150.m_secID.m_id = -2;
    local_150.m_streamSize = 0;
    local_150.m_rightChild = -1;
    local_150.m_leftChild = -1;
    local_150.m_rootNode = -1;
    Directory::load(&local_150,&stream);
    local_18c = local_188.m_rootNode;
    this_01 = std::
              map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
              ::operator[](&this->m_dirs,&local_18c);
    Directory::operator=(this_01,&local_150);
    Directory::Directory(&local_60,&local_150);
    loadChildDirectories(&this->m_dirs,&local_60,&stream);
    std::__cxx11::wstring::~wstring((wstring *)&local_60);
    std::__cxx11::wstring::~wstring((wstring *)&local_150);
    std::__cxx11::wstring::~wstring((wstring *)&local_188);
    Stream::~Stream(&stream);
    std::_Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::~_Vector_base
              (&msat.m_msat.
                super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>);
    return;
  }
  this_02 = (Exception *)__cxa_allocate_exception(0x30);
  std::__cxx11::wstring::wstring((wstring *)&local_188,L"Unable to open file : ",(allocator *)&msat)
  ;
  pcVar1 = (fileName->_M_dataplus)._M_p;
  local_150.m_name._M_dataplus._M_p = (pointer)&local_150.m_name.field_2;
  std::__cxx11::wstring::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((wstring *)&local_150,pcVar1,pcVar1 + fileName->_M_string_length);
  std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 &stream,&local_188.m_name,&local_150.m_name);
  Exception::Exception(this_02,(wstring *)&stream);
  __cxa_throw(this_02,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void
File::initialize( const std::string & fileName )
{
	if( m_stream.good() )
	{
		m_header.load( m_stream );

		MSAT msat( m_header, m_stream );
		m_sat = msat.buildSAT();

		m_ssat = loadSSAT( m_header, m_stream, m_sat );

		Stream stream( m_header, m_sat, m_header.dirStreamSecID(), m_stream );

		Directory root;
		root.load( stream );

		m_shortStreamFirstSector = root.streamSecID();

		stream.seek( root.rootNode() * dirRecordSize, Stream::FromBeginning );

		Directory rootEntry;
		rootEntry.load( stream );

		m_dirs[ root.rootNode() ] = rootEntry;

		loadChildDirectories( m_dirs, rootEntry, stream );
	}
	else
		throw Exception( std::wstring( L"Unable to open file : " ) +
			std::wstring( fileName.cbegin(), fileName.cend() ) );
}